

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::
PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
::addCatcher(PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
             *this,function<void_(const_QtPromisePrivate::PromiseError_&)> *catcher)

{
  QWriteLocker lock;
  QWriteLocker local_50;
  QThread *local_48;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> local_40;
  
  local_50.q_val = (quintptr)&this->m_lock;
  QWriteLocker::relock(&local_50);
  local_48 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::
  pair<QThread_*,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>,_true>
            (&local_40,&local_48,catcher);
  QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&this->m_catchers,&local_40);
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::~pair
            (&local_40);
  QWriteLocker::~QWriteLocker(&local_50);
  return;
}

Assistant:

void addCatcher(std::function<void(const PromiseError&)> catcher)
    {
        QWriteLocker lock{&m_lock};
        m_catchers.append({QThread::currentThread(), std::move(catcher)});
    }